

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_alpha.cpp
# Opt level: O2

void __thiscall
QAlphaPaintEngine::drawPolygon
          (QAlphaPaintEngine *this,QPointF *points,int pointCount,PolygonDrawMode mode)

{
  QAlphaPaintEnginePrivate *this_00;
  QPaintEngine *pQVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QPainterPath path;
  QRectF local_88;
  undefined8 local_60;
  undefined1 local_58 [16];
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAlphaPaintEnginePrivate **)&this->field_0x18;
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  QList<QPointF>::reserve((QList<QPointF> *)local_58,(long)pointCount);
  lVar3 = 0;
  uVar4 = 0;
  if (0 < pointCount) {
    uVar4 = (ulong)(uint)pointCount;
  }
  for (; uVar4 * 0x10 != lVar3; lVar3 = lVar3 + 0x10) {
    QList<QPointF>::emplaceBack<QPointF_const&>
              ((QList<QPointF> *)local_58,(QPointF *)((long)&points->xp + lVar3));
  }
  local_60 = 0xaaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_60);
  QPainterPath::addPolygon((QPolygonF *)&local_60);
  local_88.w._0_4_ = 0xffffffff;
  local_88.w._4_4_ = 0xffffffff;
  local_88.h._0_4_ = 0xffffffff;
  local_88.h._4_4_ = 0xffffffff;
  local_88.xp._0_4_ = 0xffffffff;
  local_88.xp._4_4_ = 0xffffffff;
  local_88.yp._0_4_ = 0xffffffff;
  local_88.yp._4_4_ = 0xffffffff;
  QAlphaPaintEnginePrivate::addPenWidth(&local_88,this_00,(QPainterPath *)&local_60);
  if (this_00->m_pass == 0) {
    this_00->m_continueCall = false;
    bVar2 = QAlphaPaintEnginePrivate::canSeeTroughBackground(this_00,this_00->m_hasalpha,&local_88);
    if ((((bVar2) || (this_00->m_advancedPen != false)) || (this_00->m_advancedBrush != false)) ||
       (this_00->m_emulateProjectiveTransforms == true)) {
      QAlphaPaintEnginePrivate::addAlphaRect(this_00,&local_88);
    }
    QAlphaPaintEnginePrivate::addDirtyRect(this_00,&local_88);
    pQVar1 = this_00->m_picengine;
    if (pQVar1 != (QPaintEngine *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x70))(pQVar1,points,pointCount,mode);
    }
  }
  else {
    bVar2 = QAlphaPaintEnginePrivate::fullyContained(this_00,&local_88);
    this_00->m_continueCall = !bVar2;
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_60);
  QArrayDataPointer<QPointF>::~QArrayDataPointer((QArrayDataPointer<QPointF> *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAlphaPaintEngine::drawPolygon(const QPointF *points, int pointCount, PolygonDrawMode mode)
{
    Q_D(QAlphaPaintEngine);

    QPolygonF poly;
    poly.reserve(pointCount);
    for (int i = 0; i < pointCount; ++i)
        poly.append(points[i]);

    QPainterPath path;
    path.addPolygon(poly);
    QRectF tr = d->addPenWidth(path);

    if (d->m_pass == 0) {
        d->m_continueCall = false;
        if (d->canSeeTroughBackground(d->m_hasalpha, tr) || d->m_advancedPen || d->m_advancedBrush
            || d->m_emulateProjectiveTransforms)
        {
            d->addAlphaRect(tr);
        }

        d->addDirtyRect(tr);

        if (d->m_picengine)
            d->m_picengine->drawPolygon(points, pointCount, mode);
    } else {
        d->m_continueCall = !d->fullyContained(tr);
    }
}